

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_hash_table_find_equal(void *val1_p,void *val2_p,int mod,void *UNUSED_cb_data)

{
  LYS_NODE LVar1;
  uint uVar2;
  lys_node *node;
  undefined8 *puVar3;
  lys_node *plVar4;
  char *pcVar5;
  hash_table *__s1;
  long lVar6;
  int iVar7;
  lys_module *plVar8;
  lys_module *plVar9;
  ulong uVar10;
  long *plVar11;
  lyd_node *node_00;
  
  if (mod != 0) {
    __assert_fail("!mod",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x485,"int resolve_hash_table_find_equal(void *, void *, int, void *)");
  }
  node = *val1_p;
  puVar3 = *val2_p;
  plVar4 = (lys_node *)*puVar3;
  if (plVar4 != node) {
    return 0;
  }
  plVar11 = *(long **)((long)val1_p + 0x10);
  LVar1 = plVar4->nodetype;
  if ((int)LVar1 < 0x10) {
    if (LVar1 == LYS_CONTAINER) {
      return 1;
    }
    if (LVar1 == LYS_LEAF) {
      return 1;
    }
    if (LVar1 == LYS_LEAFLIST) {
      pcVar5 = (char *)puVar3[7];
      lVar6 = plVar11[5];
      iVar7 = strncmp(pcVar5,(char *)plVar11[4],(long)(int)lVar6);
      if ((iVar7 == 0) && (pcVar5[(int)lVar6] == '\0')) {
        return 1;
      }
      return 0;
    }
  }
  else {
    if (LVar1 == LYS_LIST) {
      if (plVar4->padding[2] == 0) {
        __assert_fail("((struct lys_node_list *)val2->schema)->keys_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0x49c,"int resolve_hash_table_find_equal(void *, void *, int, void *)");
      }
      uVar2 = *(uint *)((long)val1_p + 8);
      if (uVar2 != plVar4->padding[2]) {
        __assert_fail("((struct lys_node_list *)val2->schema)->keys_size == pp.len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0x49d,"int resolve_hash_table_find_equal(void *, void *, int, void *)");
      }
      node_00 = (lyd_node *)puVar3[8];
      uVar10 = 0;
      if ((int)uVar2 < 1 || node_00 == (lyd_node *)0x0) {
LAB_0011d374:
        return (uint)((uint)uVar10 == uVar2);
      }
      uVar10 = 0;
      do {
        lVar6 = *plVar11;
        plVar8 = lyd_node_module(node_00);
        if (lVar6 == 0) {
          plVar9 = lys_node_module(node);
          if (plVar8 != plVar9) goto LAB_0011d374;
        }
        else {
          iVar7 = strncmp(plVar8->name,(char *)*plVar11,(long)(int)plVar11[1]);
          if ((iVar7 != 0) ||
             (plVar8 = lyd_node_module(node_00), plVar8->name[(int)plVar11[1]] != '\0'))
          goto LAB_0011d374;
        }
        pcVar5 = node_00->schema->name;
        lVar6 = plVar11[3];
        iVar7 = strncmp(pcVar5,(char *)plVar11[2],(long)(int)lVar6);
        if ((iVar7 != 0) || (pcVar5[(int)lVar6] != '\0')) goto LAB_0011d374;
        __s1 = node_00->ht;
        lVar6 = plVar11[5];
        iVar7 = strncmp((char *)__s1,(char *)plVar11[4],(long)(int)lVar6);
        if ((iVar7 != 0) || (*(char *)((long)&__s1->used + (long)(int)lVar6) != '\0'))
        goto LAB_0011d374;
        uVar10 = uVar10 + 1;
        node_00 = node_00->next;
        if ((node_00 == (lyd_node *)0x0) || (plVar11 = plVar11 + 6, uVar2 <= uVar10))
        goto LAB_0011d374;
      } while( true );
    }
    if (LVar1 == LYS_ANYXML) {
      return 1;
    }
    if (LVar1 == LYS_ANYDATA) {
      return 1;
    }
  }
  ly_log(plVar4->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
         ,0x4c5);
  return 0;
}

Assistant:

static int
resolve_hash_table_find_equal(void *val1_p, void *val2_p, int mod, void *UNUSED(cb_data))
{
    struct lyd_node *val2, *elem2;
    struct parsed_pred pp;
    const char *str;
    int i;

    assert(!mod);
    (void)mod;

    pp = *((struct parsed_pred *)val1_p);
    val2 = *((struct lyd_node **)val2_p);

    if (val2->schema != pp.schema) {
        return 0;
    }

    switch (val2->schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LEAF:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return 1;
    case LYS_LEAFLIST:
        str = ((struct lyd_node_leaf_list *)val2)->value_str;
        if (!strncmp(str, pp.pred[0].value, pp.pred[0].val_len) && !str[pp.pred[0].val_len]) {
            return 1;
        }
        return 0;
    case LYS_LIST:
        assert(((struct lys_node_list *)val2->schema)->keys_size);
        assert(((struct lys_node_list *)val2->schema)->keys_size == pp.len);

        /* lists with keys, their equivalence is based on their keys */
        elem2 = val2->child;
        /* the exact data order is guaranteed */
        for (i = 0; elem2 && (i < pp.len); ++i) {
            /* module check */
            if (pp.pred[i].mod_name) {
                if (strncmp(lyd_node_module(elem2)->name, pp.pred[i].mod_name, pp.pred[i].mod_name_len)
                        || lyd_node_module(elem2)->name[pp.pred[i].mod_name_len]) {
                    break;
                }
            } else {
                if (lyd_node_module(elem2) != lys_node_module(pp.schema)) {
                    break;
                }
            }

            /* name check */
            if (strncmp(elem2->schema->name, pp.pred[i].name, pp.pred[i].nam_len) || elem2->schema->name[pp.pred[i].nam_len]) {
                break;
            }

            /* value check */
            str = ((struct lyd_node_leaf_list *)elem2)->value_str;
            if (strncmp(str, pp.pred[i].value, pp.pred[i].val_len) || str[pp.pred[i].val_len]) {
                break;
            }

            /* next key */
            elem2 = elem2->next;
        }
        if (i == pp.len) {
            return 1;
        }
        return 0;
    default:
        break;
    }

    LOGINT(val2->schema->module->ctx);
    return 0;
}